

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
bssl::der::test::ParserTest_IncompleteEncodingTagOnly_Test::
~ParserTest_IncompleteEncodingTagOnly_Test(ParserTest_IncompleteEncodingTagOnly_Test *this)

{
  ParserTest_IncompleteEncodingTagOnly_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(ParserTest, IncompleteEncodingTagOnly) {
  const uint8_t der[] = {0x01};
  Parser parser((Input(der)));

  CBS_ASN1_TAG tag;
  Input value;
  ASSERT_FALSE(parser.ReadTagAndValue(&tag, &value));
  ASSERT_TRUE(parser.HasMore());
}